

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

anm_archive_t * anm_create(char *spec,FILE *symbolfp,uint version)

{
  list_t *list;
  short sVar1;
  undefined4 uVar2;
  thanm_instr_t *instr;
  long lVar3;
  undefined8 *__ptr;
  ulong *puVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  FILE *pFVar11;
  list_node_t *plVar12;
  undefined8 *puVar13;
  uint16_t *data;
  anm_archive_t *extraout_RAX;
  ulong *puVar14;
  ulong *__filename;
  byte *pbVar15;
  void *pvVar16;
  anm_archive_t *paVar17;
  long lVar18;
  size_t sVar19;
  size_t sVar20;
  undefined4 extraout_var;
  long *plVar21;
  ushort uVar22;
  int extraout_EDX;
  byte *pbVar23;
  size_t size;
  uint uVar24;
  list_node_t *plVar25;
  byte bVar26;
  size_t sVar27;
  undefined8 *puVar28;
  ushort uVar29;
  char *pcVar30;
  char *pcVar31;
  ulong *puVar32;
  long lVar33;
  ulong uVar34;
  int *piVar35;
  list_node_t *plVar36;
  long *plVar37;
  short *buffer;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  stringref_t ref;
  char line [128];
  undefined8 uStack_218;
  long lStack_210;
  uint uStack_208;
  uint uStack_204;
  long *plStack_200;
  long *plStack_1f8;
  long *plStack_1f0;
  long lStack_1e8;
  ulong uStack_1e0;
  size_t sStack_1d8;
  long *plStack_1d0;
  ulong *puStack_1c8;
  ulong *puStack_1c0;
  ulong *puStack_1b8;
  char *pcStack_1b0;
  FILE *pFStack_1a8;
  uint uStack_19c;
  ulong *puStack_198;
  long lStack_190;
  int iStack_184;
  ushort uStack_17e;
  ushort uStack_17a;
  char *pcStack_168;
  ulong uStack_160;
  FILE *pFStack_158;
  anm_archive_t *local_128;
  parser_state_t local_e8;
  
  uVar24 = 0x13c813;
  pFVar11 = fopen(spec,"r");
  if (pFVar11 != (FILE *)0x0) {
    fgets((char *)&local_e8,0x80,pFVar11);
    fseek(pFVar11,0,0);
    ref.len = 6;
    ref.str = "ENTRY ";
    iVar9 = util_strcmp_ref((char *)&local_e8,ref);
    if (iVar9 == 0) {
      anm_create_cold_5();
      local_128 = (anm_archive_t *)0x0;
    }
    else {
      local_e8.was_error = 0;
      local_e8.time = 0;
      local_e8.default_version = -1;
      local_e8.current_version = -1;
      local_e8.sprite_id = 0;
      local_e8.script_id = 0;
      local_128 = (anm_archive_t *)0x0;
      local_e8.script_real_index = 0;
      list_init(&local_e8.entries);
      list_init(&local_e8.globals);
      list_init(&local_e8.script_names);
      list_init(&local_e8.sprite_names);
      local_e8.current_entry = (anm_entry_t *)0x0;
      local_e8.current_script = (anm_script_t *)0x0;
      local_e8.symbol_prefix[0] = '\0';
      local_e8.symbolfp = symbolfp;
      local_e8.version = version;
      path_init(&local_e8.path_state,spec,argv0);
      thanm_yyin = (FILE *)pFVar11;
      iVar9 = thanm_yyparse(&local_e8);
      if (iVar9 == 0 && local_e8.was_error == 0) {
        path_free(&local_e8.path_state);
        local_128 = (anm_archive_t *)util_malloc(0x30);
        list = &local_128->names;
        local_128->map = (uchar *)0x0;
        local_128->map_size = 0;
        list_init(list);
        (local_128->entries).head = local_e8.entries.head;
        (local_128->entries).tail = local_e8.entries.tail;
        for (plVar12 = (local_128->entries).head; plVar12 != (list_node_t *)0x0;
            plVar12 = plVar12->next) {
          pvVar16 = plVar12->data;
          plVar25 = (list_node_t *)list;
          do {
            plVar25 = plVar25->next;
            if (plVar25 == (list_node_t *)0x0) {
              list_append_new(list,*(void **)((long)pvVar16 + 0x10));
              goto LAB_0010f2cd;
            }
            pcVar31 = (char *)plVar25->data;
            pcVar30 = *(char **)((long)pvVar16 + 0x10);
            iVar9 = strcmp(pcVar30,pcVar31);
          } while (iVar9 != 0);
          free(pcVar30);
          *(char **)((long)pvVar16 + 0x10) = pcVar31;
LAB_0010f2cd:
          for (puVar13 = *(undefined8 **)((long)pvVar16 + 0x48); puVar13 != (undefined8 *)0x0;
              puVar13 = (undefined8 *)*puVar13) {
            lVar18 = puVar13[2];
            plVar21 = *(long **)(lVar18 + 0x10);
            if (plVar21 != (long *)0x0) {
              do {
                instr = (thanm_instr_t *)plVar21[2];
                uVar24 = 8;
                for (plVar25 = (instr->params).head; plVar25 != (list_node_t *)0x0;
                    plVar25 = plVar25->next) {
                  uVar24 = uVar24 + (uint)(*plVar25->data != 0x73) * 2 + 2;
                }
                data = (uint16_t *)util_malloc((ulong)uVar24);
                *data = instr->id;
                data[1] = (short)uVar24 - 8;
                data[2] = instr->time;
                data[3] = 0;
                plVar25 = (instr->params).head;
                if (plVar25 != (list_node_t *)0x0) {
                  bVar26 = 0;
                  lVar33 = 0;
                  do {
                    piVar35 = (int *)plVar25->data;
                    if (piVar35[1] != 0) {
                      data[3] = data[3] | (ushort)(1 << (bVar26 & 0x1f));
                    }
                    iVar9 = *piVar35;
                    if (iVar9 < 0x6e) {
                      if (iVar9 == 0x4e) {
                        pcVar31 = *(char **)(*(long *)(piVar35 + 4) + 8);
                        plVar36 = (list_node_t *)&local_e8.script_names;
                        do {
                          plVar36 = plVar36->next;
                          if (plVar36 == (list_node_t *)0x0) {
                            anm_create_cold_1();
                            goto switchD_0010f3bb_caseD_70;
                          }
                          piVar35 = (int *)plVar36->data;
                          iVar9 = strcmp(*(char **)(piVar35 + 2),pcVar31);
                        } while (iVar9 != 0);
                        goto LAB_0010f4b7;
                      }
                      if ((iVar9 == 0x53) || (iVar9 == 0x66)) {
                        iVar9 = *(int *)(*(long *)(piVar35 + 4) + 8);
                        goto LAB_0010f4bf;
                      }
                      goto switchD_0010f3bb_caseD_70;
                    }
                    switch(iVar9) {
                    case 0x6e:
                      pcVar31 = *(char **)(*(long *)(piVar35 + 4) + 8);
                      plVar36 = (list_node_t *)&local_e8.sprite_names;
                      do {
                        plVar36 = plVar36->next;
                        if (plVar36 == (list_node_t *)0x0) {
                          anm_create_cold_2();
                          goto switchD_0010f3bb_caseD_70;
                        }
                        piVar35 = (int *)plVar36->data;
                        iVar9 = strcmp(*(char **)(piVar35 + 2),pcVar31);
                      } while (iVar9 != 0);
                      goto LAB_0010f4b7;
                    case 0x6f:
                      pcVar31 = *(char **)(*(long *)(piVar35 + 4) + 8);
                      plVar37 = (long *)(lVar18 + 0x30);
                      do {
                        plVar37 = (long *)*plVar37;
                        if (plVar37 == (long *)0x0) {
                          anm_create_cold_4();
                          goto switchD_0010f3bb_caseD_70;
                        }
                        piVar35 = (int *)plVar37[2];
                        iVar9 = strcmp(*(char **)(piVar35 + 2),pcVar31);
                      } while (iVar9 != 0);
LAB_0010f4b7:
                      iVar9 = *piVar35;
LAB_0010f4bf:
                      *(int *)((long)data + lVar33 + 8) = iVar9;
                      lVar33 = lVar33 + 4;
                      break;
                    case 0x73:
                      *(undefined2 *)((long)data + lVar33 + 8) =
                           *(undefined2 *)(*(long *)(piVar35 + 4) + 8);
                      lVar33 = lVar33 + 2;
                      break;
                    case 0x74:
                      pcVar31 = *(char **)(*(long *)(piVar35 + 4) + 8);
                      plVar37 = (long *)(lVar18 + 0x30);
                      do {
                        plVar37 = (long *)*plVar37;
                        if (plVar37 == (long *)0x0) {
                          anm_create_cold_3();
                          goto switchD_0010f3bb_caseD_70;
                        }
                        lVar3 = plVar37[2];
                        iVar9 = strcmp(*(char **)(lVar3 + 8),pcVar31);
                      } while (iVar9 != 0);
                      iVar9 = (int)*(short *)(lVar3 + 4);
                      goto LAB_0010f4bf;
                    }
switchD_0010f3bb_caseD_70:
                    bVar26 = bVar26 + 1;
                    plVar25 = plVar25->next;
                  } while (plVar25 != (list_node_t *)0x0);
                }
                list_append_new((list_t *)(lVar18 + 0x20),data);
                thanm_instr_free(instr);
                plVar21 = (long *)*plVar21;
              } while (plVar21 != (long *)0x0);
            }
            list_free_nodes((list_t *)(lVar18 + 0x10));
            for (puVar28 = *(undefined8 **)(lVar18 + 0x30); puVar28 != (undefined8 *)0x0;
                puVar28 = (undefined8 *)*puVar28) {
              pvVar16 = (void *)puVar28[2];
              free(*(void **)((long)pvVar16 + 8));
              free(pvVar16);
            }
            list_free_nodes((list_t *)(lVar18 + 0x30));
            for (puVar28 = *(undefined8 **)(lVar18 + 0x40); puVar28 != (undefined8 *)0x0;
                puVar28 = (undefined8 *)*puVar28) {
              __ptr = (undefined8 *)puVar28[2];
              free((void *)*__ptr);
              free(__ptr);
            }
            list_free_nodes((list_t *)(lVar18 + 0x40));
          }
        }
        reg_free_user();
        for (; local_e8.sprite_names.head != (list_node_t *)0x0;
            local_e8.sprite_names.head = (local_e8.sprite_names.head)->next) {
          pvVar16 = (local_e8.sprite_names.head)->data;
          free(*(void **)((long)pvVar16 + 8));
          free(pvVar16);
        }
        list_free_nodes(&local_e8.sprite_names);
        for (; local_e8.script_names.head != (list_node_t *)0x0;
            local_e8.script_names.head = (local_e8.script_names.head)->next) {
          pvVar16 = (local_e8.script_names.head)->data;
          free(*(void **)((long)pvVar16 + 8));
          free(pvVar16);
        }
        list_free_nodes(&local_e8.script_names);
        for (; local_e8.globals.head != (list_node_t *)0x0;
            local_e8.globals.head = (local_e8.globals.head)->next) {
          puVar13 = (undefined8 *)(local_e8.globals.head)->data;
          free((void *)*puVar13);
          thanm_param_free((thanm_param_t *)puVar13[1]);
        }
        list_free_nodes(&local_e8.globals);
      }
    }
    return local_128;
  }
  pcVar31 = spec;
  anm_create_cold_6();
  plVar21 = *(long **)(pcVar31 + 0x20);
  paVar17 = extraout_RAX;
  if (plVar21 != (long *)0x0) {
    puVar14 = (ulong *)(ulong)uVar24;
    uStack_19c = uVar24;
    pcStack_168 = spec;
    uStack_160 = (ulong)version;
    pFStack_158 = symbolfp;
    do {
      pcVar31 = "rb";
      puVar4 = (ulong *)plVar21[2];
      paVar17 = (anm_archive_t *)*puVar4;
      if (*(short *)((long)&paVar17[1].map + 4) != 0) {
        __filename = (ulong *)puVar4[4];
        if (__filename == (ulong *)0x0) {
          __filename = (ulong *)puVar4[2];
        }
        pcVar30 = "rb";
        pFStack_1a8 = (FILE *)0x10f6d4;
        pFVar11 = fopen((char *)__filename,"rb");
        if ((int)puVar14 == 0x13) {
          puStack_198 = __filename;
          if (pFVar11 != (FILE *)0x0) {
            pFStack_1a8 = (FILE *)0x10f6fe;
            fseek(pFVar11,0,2);
            pFStack_1a8 = (FILE *)0x10f706;
            puVar14 = (ulong *)ftell(pFVar11);
            pFStack_1a8 = (FILE *)0x10f715;
            fseek(pFVar11,0,0);
            uVar24 = (uint)puVar14;
            *(uint *)(puVar4[1] + 0xc) = uVar24;
            pcVar31 = (char *)((ulong)puVar14 & 0xffffffff);
            pFStack_1a8 = (FILE *)0x10f729;
            __filename = (ulong *)malloc((size_t)pcVar31);
            pFStack_1a8 = (FILE *)0x10f73f;
            fread(__filename,1,(size_t)pcVar31,pFVar11);
            pFStack_1a8 = (FILE *)0x10f747;
            fclose(pFVar11);
            if (uVar24 < 0x1c) {
              if (10 < uVar24) goto LAB_0010f80b;
            }
            else {
              if ((*__filename == 0xa1a0a0d474e5089) &&
                 (*(int *)((long)__filename + 0xc) == 0x52444849)) {
                uVar8 = *(ushort *)((long)__filename + 0x12) << 8 |
                        *(ushort *)((long)__filename + 0x12) >> 8;
                pbVar23 = (byte *)((long)__filename + 0x16);
                pbVar15 = (byte *)((long)__filename + 0x17);
LAB_0010f8ac:
                uVar22 = CONCAT11(*pbVar23,*pbVar15);
                puVar4[0xb] = (ulong)__filename;
                puVar14 = (ulong *)(ulong)uStack_19c;
                goto LAB_0010f8c8;
              }
LAB_0010f80b:
              if ((((int)*__filename == -0x1f002701) &&
                  (*(byte *)((long)__filename + 10) == 0 &&
                   *(int *)((long)__filename + 6) == 0x4649464a)) ||
                 (((int)*__filename == -0x1e002701 &&
                  (*(byte *)((long)__filename + 10) == 0 &&
                   *(int *)((long)__filename + 6) == 0x66697845)))) {
                puVar14 = (ulong *)((long)__filename + (long)pcVar31);
                puVar32 = __filename;
                do {
                  pFStack_1a8 = (FILE *)0x10f868;
                  pvVar16 = memchr(puVar32,0xff,(long)puVar14 - (long)puVar32);
                  if ((pvVar16 == (void *)0x0) ||
                     (puVar32 = (ulong *)((long)pvVar16 + 1), puVar32 == puVar14))
                  goto LAB_0010f97e;
                } while ((*(byte *)puVar32 | 2) != 0xc2);
                puVar14 = (ulong *)((long)puVar14 - (long)pvVar16);
                if ((ulong *)0x8 < puVar14) {
                  uVar8 = *(ushort *)((long)pvVar16 + 7) << 8 | *(ushort *)((long)pvVar16 + 7) >> 8;
                  pbVar23 = (byte *)((long)pvVar16 + 5);
                  pbVar15 = (byte *)((long)pvVar16 + 6);
                  goto LAB_0010f8ac;
                }
              }
            }
LAB_0010f97e:
            pFStack_1a8 = (FILE *)0x10f98b;
            pcVar30 = (char *)__filename;
            anm_defaults_cold_3();
          }
          pFStack_1a8 = (FILE *)0x10f995;
          anm_defaults_cold_4();
        }
        else {
          if (pFVar11 == (FILE *)0x0) goto LAB_0010f99d;
          pcVar30 = (char *)0x1c;
          pFStack_1a8 = (FILE *)0x10f7af;
          sVar19 = fread(&lStack_190,0x1c,1,pFVar11);
          if (((sVar19 == 1) && (lStack_190 == 0xa1a0a0d474e5089)) && (iStack_184 == 0x52444849)) {
            pFStack_1a8 = (FILE *)0x10f7e4;
            fclose(pFVar11);
            uVar8 = uStack_17e << 8 | uStack_17e >> 8;
            uVar22 = uStack_17a << 8 | uStack_17a >> 8;
LAB_0010f8c8:
            paVar17 = (anm_archive_t *)(ulong)uVar22;
            uVar34 = *puVar4;
            if (*(int *)(uVar34 + 0xc) == 0xffff) {
              uVar24 = 1;
              do {
                uVar10 = uVar24;
                uVar24 = uVar10 * 2;
              } while (uVar10 < uVar8);
              *(uint *)(uVar34 + 0xc) = uVar10;
            }
            if (*(int *)(uVar34 + 0x10) == 0xffff) {
              uVar24 = 1;
              do {
                uVar10 = uVar24;
                uVar24 = uVar10 * 2;
              } while (uVar10 < uVar22);
              *(uint *)(uVar34 + 0x10) = uVar10;
            }
            if (*(short *)(uVar34 + 0x34) == 1) {
              uVar5 = puVar4[1];
              uVar29 = *(ushort *)(uVar5 + 6);
              if (uVar29 == 0xffff) {
                uVar29 = *(ushort *)(uVar34 + 0x14);
                *(ushort *)(uVar5 + 6) = uVar29;
              }
              uVar24 = (uint)*(ushort *)(uVar5 + 8);
              if (*(ushort *)(uVar5 + 8) == 0xffff) {
                *(ushort *)(uVar5 + 8) = uVar8;
                uVar24 = (uint)uVar8;
              }
              uVar8 = *(ushort *)(uVar5 + 10);
              if (*(ushort *)(uVar5 + 10) == 0xffff) {
                *(ushort *)(uVar5 + 10) = uVar22;
                uVar8 = uVar22;
              }
              if (*(int *)(uVar5 + 0xc) == 0xffff) {
                pFStack_1a8 = (FILE *)0x10f958;
                uVar10 = format_Bpp((uint)uVar29);
                uVar10 = uVar10 * uVar8 * uVar24;
                paVar17 = (anm_archive_t *)(ulong)uVar10;
                *(uint *)(puVar4[1] + 0xc) = uVar10;
              }
            }
            goto LAB_0010f963;
          }
        }
        pFStack_1a8 = (FILE *)0x10f99d;
        anm_defaults_cold_1();
LAB_0010f99d:
        pFStack_1a8 = (FILE *)anm_write;
        puVar32 = __filename;
        anm_defaults_cold_2();
        plStack_1d0 = plVar21;
        puStack_1c8 = puVar4;
        puStack_1c0 = __filename;
        puStack_1b8 = puVar14;
        pcStack_1b0 = pcVar31;
        pFStack_1a8 = pFVar11;
        pFVar11 = fopen(pcVar30,"wb");
        if (pFVar11 == (FILE *)0x0) {
          anm_write_cold_1();
          uVar7 = *(ulong *)pcVar30;
          *(ulong *)pcVar30 =
               (ulong)(CONCAT24((short)((uint)*(undefined4 *)((long)pcVar30 + 4) >> 0x10),
                                *(undefined4 *)((long)pcVar30 + 4)) & 0xffff0000ffff);
          *(undefined4 *)((long)pcVar30 + 8) = 0;
          *(ulong *)((long)pcVar30 + 0xc) =
               (ulong)CONCAT24((short)((uint)*(undefined4 *)((long)pcVar30 + 10) >> 0x10),
                               *(undefined4 *)((long)pcVar30 + 10)) & 0xffffffff0000ffff;
          uVar2 = *(undefined4 *)((long)pcVar30 + 0x14);
          *(uint *)((long)pcVar30 + 0x14) = (uint)*(ushort *)((long)pcVar30 + 0xe);
          uVar34 = *(ulong *)((long)pcVar30 + 0x18);
          uVar5 = *(ulong *)((long)pcVar30 + 0x20);
          *(ulong *)((long)pcVar30 + 0x20) =
               (ulong)CONCAT24((short)((uint)uVar2 >> 0x10),uVar2) & 0xffffffff0000ffff;
          *(undefined4 *)((long)pcVar30 + 0x18) = 0;
          *(int *)((long)pcVar30 + 0x1c) = (int)*(ulong *)((long)pcVar30 + 0x10);
          *(ulong *)((long)pcVar30 + 0x2c) = uVar34;
          *(ulong *)((long)pcVar30 + 0x34) = uVar5;
          uVar34 = *(ulong *)((long)pcVar30 + 0x28);
          *(int *)((long)pcVar30 + 0x28) = (int)uVar7;
          *(uint *)((long)pcVar30 + 0x3c) = (uint)uVar34;
          return (anm_archive_t *)(ulong)(uint)uVar34;
        }
        plVar21 = (long *)puVar32[4];
        if (plVar21 != (long *)0x0) {
          sVar27 = 0x14;
          sStack_1d8 = sVar27;
          if (extraout_EDX == 0x13) {
            sVar27 = 0x28;
            sStack_1d8 = sVar27;
          }
          do {
            plVar37 = (long *)plVar21[2];
            plStack_1f8 = plVar21;
            lVar18 = file_tell((FILE *)pFVar11);
            fflush(pFVar11);
            sVar19 = strlen((char *)plVar37[2]);
            plStack_1f0 = plVar37 + 7;
            uStack_208 = 0xffffffff;
            uVar24 = 0;
            plVar21 = plStack_1f0;
            do {
              uStack_1e0 = (ulong)uVar24;
              plVar21 = (long *)*plVar21;
              uStack_208 = uStack_208 + 1;
              uVar24 = uVar24 + 1;
            } while (plVar21 != (long *)0x0);
            plStack_200 = plVar37 + 9;
            uStack_204 = 0xffffffff;
            plVar21 = plStack_200;
            do {
              plVar21 = (long *)*plVar21;
              uStack_204 = uStack_204 + 1;
            } while (plVar21 != (long *)0x0);
            file_seek((FILE *)pFVar11,lVar18 + (ulong)uStack_208 * 4 + (ulong)uStack_204 * 8 + 0x40)
            ;
            lVar33 = file_tell((FILE *)pFVar11);
            *(int *)(*plVar37 + 0x1c) = (int)lVar33 - (int)lVar18;
            pcVar31 = (char *)plVar37[2];
            lStack_210 = lVar18;
            sVar20 = strlen(pcVar31);
            file_write((FILE *)pFVar11,pcVar31,sVar20);
            file_write((FILE *)pFVar11,"",0x10 - (ulong)((uint)sVar19 & 0xf));
            if (((char *)plVar37[3] != (char *)0x0) && (*(int *)(*plVar37 + 0x28) == 0)) {
              sVar19 = strlen((char *)plVar37[3]);
              lVar18 = file_tell((FILE *)pFVar11);
              *(int *)(*plVar37 + 0x24) = (int)lVar18 - (int)lStack_210;
              pcVar31 = (char *)plVar37[3];
              sVar20 = strlen(pcVar31);
              file_write((FILE *)pFVar11,pcVar31,sVar20);
              file_write((FILE *)pFVar11,"",0x10 - (ulong)((uint)sVar19 & 0xf));
            }
            lStack_1e8 = file_tell((FILE *)pFVar11);
            for (puVar13 = (undefined8 *)*plStack_1f0; puVar13 != (undefined8 *)0x0;
                puVar13 = (undefined8 *)*puVar13) {
              file_write((FILE *)pFVar11,(void *)puVar13[2],sVar27);
            }
            lVar18 = lStack_210;
            for (puVar13 = (undefined8 *)*plStack_200; iVar9 = (int)lVar18,
                puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
              lVar33 = puVar13[2];
              lVar18 = file_tell((FILE *)pFVar11);
              *(int *)(*(long *)(lVar33 + 8) + 4) = (int)lVar18 - iVar9;
              for (puVar28 = *(undefined8 **)(lVar33 + 0x20); sVar27 = sStack_1d8,
                  lVar18 = lStack_210, uVar34 = uStack_218, puVar28 != (undefined8 *)0x0;
                  puVar28 = (undefined8 *)*puVar28) {
                buffer = (short *)puVar28[2];
                if (*(int *)(*plVar37 + 0x28) == 0) {
                  uStack_218._4_4_ = SUB84(uVar34,4);
                  uStack_218._0_4_ = CONCAT13((char)buffer[1],CONCAT12((char)*buffer,buffer[2]));
                  file_write((FILE *)pFVar11,&uStack_218,4);
                  sVar27 = uStack_218 >> 0x18 & 0xff;
                  if (sVar27 != 0) {
                    buffer = buffer + 4;
                    goto LAB_0010fbfb;
                  }
                }
                else {
                  if (*buffer == -1) {
                    buffer[1] = 0;
                    sVar27 = 8;
                  }
                  else {
                    sVar1 = buffer[1];
                    buffer[1] = sVar1 + 8U;
                    sVar27 = (size_t)(ushort)(sVar1 + 8U);
                  }
LAB_0010fbfb:
                  file_write((FILE *)pFVar11,buffer,sVar27);
                }
              }
              if (*(int *)(lVar33 + 0x50) == 0) {
                if (*(int *)(*plVar37 + 0x28) == 0) {
                  uStack_218 = uStack_218 & 0xffffffff00000000;
                  size = 4;
                }
                else {
                  uStack_218 = 0xffff;
                  size = 8;
                }
                file_write((FILE *)pFVar11,&uStack_218,size);
              }
            }
            if (*(short *)(*plVar37 + 0x34) != 0) {
              lVar33 = file_tell((FILE *)pFVar11);
              *(int *)(*plVar37 + 0x30) = (int)lVar33 - iVar9;
              file_write((FILE *)pFVar11,(void *)plVar37[1],0x10);
              file_write((FILE *)pFVar11,(void *)plVar37[0xb],(ulong)*(uint *)(plVar37[1] + 0xc));
            }
            if (*plStack_1f8 == 0) {
              uVar24 = 0;
            }
            else {
              lVar33 = file_tell((FILE *)pFVar11);
              uVar24 = (int)lVar33 - iVar9;
            }
            puVar6 = (uint *)*plVar37;
            puVar6[0xe] = uVar24;
            *puVar6 = uStack_208;
            puVar6[1] = uStack_204;
            file_seek((FILE *)pFVar11,lVar18);
            puVar14 = (ulong *)*plVar37;
            if ((uint)puVar14[5] < 7) {
              file_write((FILE *)pFVar11,puVar14,0x40);
            }
            else {
              uVar2 = *(undefined4 *)((long)puVar14 + 0x3c);
              uVar34 = *(ulong *)((long)puVar14 + 0x2c);
              uVar5 = *(ulong *)((long)puVar14 + 0x34);
              *(undefined8 *)((long)puVar14 + 0x2c) = 0;
              *(undefined8 *)((long)puVar14 + 0x34) = 0;
              *(undefined4 *)((long)puVar14 + 0x3c) = 0;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *puVar14;
              auVar38 = pshuflw(auVar38,auVar38,0xe8);
              *(int *)((long)puVar14 + 4) = auVar38._0_4_;
              *(undefined2 *)(puVar14 + 1) = 0;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)puVar14 + 0xc);
              auVar38 = pshuflw(auVar39,auVar39,0xe8);
              *(int *)((long)puVar14 + 10) = auVar38._0_4_;
              *(undefined2 *)((long)puVar14 + 0xe) = *(undefined2 *)((long)puVar14 + 0x14);
              *(undefined4 *)(puVar14 + 2) = *(undefined4 *)((long)puVar14 + 0x1c);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = puVar14[4];
              auVar38 = pshuflw(auVar40,auVar40,0xe8);
              *(int *)((long)puVar14 + 0x14) = auVar38._0_4_;
              *(uint *)puVar14 = (uint)puVar14[5];
              puVar14[3] = uVar34;
              puVar14[4] = uVar5;
              *(undefined4 *)(puVar14 + 5) = uVar2;
              file_write((FILE *)pFVar11,(void *)*plVar37,0x40);
              convert_header_to_old((anm_header06_t *)*plVar37);
            }
            if (uStack_208 != 0) {
              iVar9 = (int)lStack_1e8 - (int)lStack_210;
              uVar34 = uStack_1e0;
              do {
                uStack_218 = CONCAT44(uStack_218._4_4_,iVar9);
                file_write((FILE *)pFVar11,&uStack_218,4);
                iVar9 = iVar9 + (int)sVar27;
                uVar24 = (int)uVar34 - 1;
                uVar34 = (ulong)uVar24;
              } while (uVar24 != 0);
            }
            for (puVar13 = (undefined8 *)*plStack_200; puVar13 != (undefined8 *)0x0;
                puVar13 = (undefined8 *)*puVar13) {
              file_write((FILE *)pFVar11,*(void **)(puVar13[2] + 8),8);
            }
            file_seek((FILE *)pFVar11,lStack_210 + (ulong)*(uint *)(*plVar37 + 0x38));
            plVar21 = (long *)*plStack_1f8;
          } while (plVar21 != (long *)0x0);
        }
        iVar9 = fclose(pFVar11);
        return (anm_archive_t *)CONCAT44(extraout_var,iVar9);
      }
LAB_0010f963:
      plVar21 = (long *)*plVar21;
    } while (plVar21 != (long *)0x0);
  }
  return paVar17;
}

Assistant:

static anm_archive_t*
anm_create(
    char* spec,
    FILE* symbolfp,
    unsigned version
) {
    FILE* in = fopen(spec, "r");
    if (!in) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, spec, strerror(errno));
        exit(1);
    }
    if (anm_is_old_format(in)) {
        fprintf(stderr, "%s: %s: the spec file was made using an old version\n"
                        "of thanm and uses the old format, which is no longer supported.\n"
                        "Please use the old version of thanm to create the ANM file, and\n"
                        "re-dump it using this version.\n", argv0, spec);
        return NULL;
    }

    parser_state_t state;
    state.was_error = 0;
    state.time = 0;
    state.default_version = -1;
    state.current_version = -1;
    state.sprite_id = 0;
    state.script_id = 0;
    state.script_real_index = 0;
    list_init(&state.entries);
    list_init(&state.globals);
    list_init(&state.script_names);
    list_init(&state.sprite_names);
    state.current_entry = NULL;
    state.current_script = NULL;
    state.symbolfp = symbolfp;
    strcpy(state.symbol_prefix, "");
    state.version = version;

    path_init(&state.path_state, spec, argv0);

    thanm_yyin = in;
    if (thanm_yyparse(&state) || state.was_error)
        return NULL;

    path_free(&state.path_state);

    anm_archive_t* anm = (anm_archive_t*)util_malloc(sizeof(anm_archive_t));
    anm->map = NULL;
    anm->map_size = 0;
    list_init(&anm->names);
    anm->entries = state.entries;

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        char* name;
        int found = 0;
        list_for_each(&anm->names, name) {
            if (strcmp(entry->name, name) == 0) {
                free(entry->name);
                entry->name = name;
                found = 1;
                break;
            }
        }
        if (!found)
            list_append_new(&anm->names, entry->name);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            anm_serialize_script(&state, script);

            /* Free vars. */
            var_t* var;
            list_for_each(&script->vars, var) {
                var_free(var);
            }
            list_free_nodes(&script->vars);
        }
    }

    /* Free stuff. */
    reg_free_user();

    symbol_id_pair_t* symbol;
    list_for_each(&state.sprite_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.sprite_names);

    list_for_each(&state.script_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.script_names);

    global_t* global;
    list_for_each(&state.globals, global) {
        free(global->name);
        thanm_param_free(global->param);
    }
    list_free_nodes(&state.globals);

    return anm;
}